

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_BOOL qpdf_oh_get_value_as_ulonglong(qpdf_data qpdf,qpdf_oh oh,unsigned_long_long *value)

{
  int iVar1;
  anon_class_8_1_a8c68091 local_68;
  function<int_(QPDFObjectHandle_&)> local_60;
  function<int_()> local_40;
  unsigned_long_long *local_20;
  unsigned_long_long *value_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_20 = value;
  value_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_40,return_false);
  local_68.value = local_20;
  std::function<int(QPDFObjectHandle&)>::function<qpdf_oh_get_value_as_ulonglong::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_60,&local_68);
  iVar1 = do_with_oh<int>(qpdf,oh,&local_40,&local_60);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<int_()>::~function(&local_40);
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_get_value_as_ulonglong(qpdf_data qpdf, qpdf_oh oh, unsigned long long* value)
{
    return do_with_oh<QPDF_BOOL>(qpdf, oh, return_false, [value](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_value_as_ulonglong");
        return o.getValueAsUInt(*value);
    });
}